

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O0

bool __thiscall TypeInfo::testComplexTypes(TypeInfo *this)

{
  bool bVar1;
  XMLCh *pXVar2;
  DOMElement *pDVar3;
  long *plVar4;
  XMLCh *pXVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  wchar16 *pwVar9;
  bool local_14a;
  bool local_ca;
  XStr local_90;
  XStr local_88;
  byte local_79;
  XStr local_78;
  XStr local_70;
  XStr local_68;
  XStr local_60;
  byte local_51;
  XStr local_50;
  XStr local_48 [3];
  XStr local_30;
  DOMElement *local_28;
  DOMElement *testEle;
  DOMNode *docEle;
  TypeInfo *pTStack_10;
  bool passed;
  TypeInfo *this_local;
  
  docEle._7_1_ = 1;
  pTStack_10 = this;
  testEle = (DOMElement *)(**(code **)(*(long *)this->doc + 0x68))();
  XStr::XStr(&local_30,"complexTest");
  pXVar2 = XStr::unicodeForm(&local_30);
  pDVar3 = findElement(this,pXVar2);
  XStr::~XStr(&local_30);
  local_28 = pDVar3;
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x1d8))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(local_48,"complexTestType");
  local_51 = 0;
  pXVar5 = XStr::unicodeForm(local_48);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_ca = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    XStr::XStr(&local_50,"");
    local_51 = 1;
    pXVar5 = XStr::unicodeForm(&local_50);
    local_ca = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  }
  tmp = local_ca;
  if ((local_51 & 1) != 0) {
    XStr::~XStr(&local_50);
  }
  XStr::~XStr(local_48);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1de);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_60,"complexTestType");
    pXVar2 = XStr::unicodeForm(&local_60);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_68,"");
    pXVar2 = XStr::unicodeForm(&local_68);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_68);
    XStr::~XStr(&local_60);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x50))();
  local_28 = (DOMElement *)(**(code **)(*plVar4 + 0x50))();
  plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_70,"complexDerTestType");
  local_79 = 0;
  pXVar5 = XStr::unicodeForm(&local_70);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_14a = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    XStr::XStr(&local_78,"");
    local_79 = 1;
    pXVar5 = XStr::unicodeForm(&local_78);
    local_14a = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  }
  tmp = local_14a;
  if ((local_79 & 1) != 0) {
    XStr::~XStr(&local_78);
  }
  XStr::~XStr(&local_70);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e1);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_88,"complexDerTestType");
    pXVar2 = XStr::unicodeForm(&local_88);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_90,"");
    pXVar2 = XStr::unicodeForm(&local_90);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_90);
    XStr::~XStr(&local_88);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_28 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  return (bool)(docEle._7_1_ & 1);
}

Assistant:

bool TypeInfo::testComplexTypes() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning

    //element complexTest
    DOMElement *testEle = findElement(X("complexTest"));
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("complexTestType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("complexDerTestType"), X(""), __LINE__);
    return passed;
}